

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O2

void __thiscall QBalloonTip::balloon(QBalloonTip *this,QPoint *pos,int msecs,bool showArrow)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Representation RVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined8 uVar10;
  QPalette *pQVar11;
  QColor *pQVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int ax;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long in_FS_OFFSET;
  double y;
  undefined1 auVar21 [16];
  QBrush local_a8 [8];
  QPen local_a0 [8];
  QPainter painter2;
  QPainter painter1;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  double local_70;
  QPainterPath path;
  QSize local_58;
  QColor local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->showArrow = showArrow;
  lVar9 = QGuiApplication::screenAt(pos);
  if (lVar9 == 0) {
    QGuiApplication::primaryScreen();
  }
  auVar21 = QScreen::geometry();
  uVar10 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  iVar13 = (int)uVar10 + (pos->xp).m_i + -0x12;
  iVar14 = (pos->yp).m_i + (int)((ulong)uVar10 >> 0x20) + 0x12;
  iVar18 = (auVar21._12_4_ - auVar21._4_4_) + 1;
  iVar19 = auVar21._8_4_;
  iVar17 = auVar21._0_4_;
  iVar7 = (iVar19 - iVar17) + 1;
  iVar16 = 3;
  if (iVar14 < iVar18) {
    iVar16 = 0x15;
  }
  iVar20 = 0x15;
  if (iVar14 < iVar18) {
    iVar20 = 3;
  }
  uVar15 = 0x12;
  if (iVar18 <= iVar14) {
    uVar15 = 0;
  }
  QWidget::setContentsMargins(&this->super_QWidget,4,iVar16,4,iVar20);
  QWidget::updateGeometry(&this->super_QWidget);
  uVar10 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  local_58 = (QSize)(**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  iVar20 = (-(uint)(iVar14 < iVar18) | 0xffffffed) + local_58.ht.m_i.m_i;
  RVar6 = local_58.wd.m_i;
  _path = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath(&path);
  y = (double)uVar15;
  QPainterPath::moveTo(&path,7.0,y);
  iVar16 = (int)uVar10;
  if ((iVar18 <= iVar14) || (iVar7 <= iVar13)) {
    if (iVar14 < iVar18 && iVar7 <= iVar13) {
      if (showArrow) {
        QPainterPath::lineTo(&path,(double)(RVar6.m_i + -0x25),y);
        QPainterPath::lineTo(&path,(double)(RVar6.m_i + -0x13),(double)(int)(uVar15 - 0x12));
        QPainterPath::lineTo(&path,(double)(RVar6.m_i + -0x13),y);
      }
      iVar8 = ((pos->xp).m_i - iVar16) + 0x12;
      ax = (iVar19 - iVar16) + -2;
      if (iVar8 < ax) {
        ax = iVar8;
      }
      goto LAB_0036c1a2;
    }
  }
  else {
    if (showArrow) {
      QPainterPath::lineTo(&path,18.0,y);
      QPainterPath::lineTo(&path,18.0,(double)(int)(uVar15 - 0x12));
      QPainterPath::lineTo(&path,36.0,y);
    }
    ax = (pos->xp).m_i + -0x12;
    if (ax <= iVar17 + 2) {
      ax = iVar17 + 2;
    }
LAB_0036c1a2:
    QWidget::move(&this->super_QWidget,ax,(pos->yp).m_i);
  }
  QPainterPath::lineTo(&path,(double)(RVar6.m_i + -8),y);
  dVar1 = (double)(RVar6.m_i + -0xf);
  dVar2 = (double)(((long)(RVar6.m_i + -2) - (long)(RVar6.m_i + -0xf)) + 1);
  dVar3 = (double)(int)(((uVar15 | 0xd) - uVar15) + 1);
  local_88 = (undefined1 *)dVar1;
  puStack_80 = (undefined1 *)y;
  local_78 = (undefined1 *)dVar2;
  local_70 = dVar3;
  QPainterPath::arcTo((QRectF *)&path,90.0,-90.0);
  QPainterPath::lineTo(&path,(double)(RVar6.m_i + -1),(double)(iVar20 + -7));
  dVar4 = (double)(iVar20 + -0xe);
  dVar5 = (double)(((long)(iVar20 + -1) - (long)(iVar20 + -0xe)) + 1);
  local_88 = (undefined1 *)dVar1;
  puStack_80 = (undefined1 *)dVar4;
  local_78 = (undefined1 *)dVar2;
  local_70 = dVar5;
  QPainterPath::arcTo((QRectF *)&path,0.0,-90.0);
  dVar1 = (double)iVar20;
  if ((iVar14 < iVar18) || (iVar13 < iVar7)) {
    if (iVar14 < iVar18 || iVar7 <= iVar13) goto LAB_0036c3f9;
    if (showArrow) {
      QPainterPath::lineTo(&path,36.0,dVar1);
      QPainterPath::lineTo(&path,18.0,(double)(iVar20 + 0x12));
      QPainterPath::lineTo(&path,18.0,dVar1);
    }
    iVar7 = (pos->xp).m_i + -0x12;
    iVar16 = iVar17 + 2;
    if (iVar17 + 2 < iVar7) {
      iVar16 = iVar7;
    }
  }
  else {
    if (showArrow) {
      QPainterPath::lineTo(&path,(double)(RVar6.m_i + -0x13),dVar1);
      QPainterPath::lineTo(&path,(double)(RVar6.m_i + -0x13),(double)(iVar20 + 0x12));
      QPainterPath::lineTo(&path,(double)(RVar6.m_i + -0x25),dVar1);
    }
    iVar7 = ((pos->xp).m_i - iVar16) + 0x12;
    iVar16 = (iVar19 - iVar16) + -2;
    if (iVar7 < iVar16) {
      iVar16 = iVar7;
    }
  }
  QWidget::move(&this->super_QWidget,iVar16,(pos->yp).m_i - (int)((ulong)uVar10 >> 0x20));
LAB_0036c3f9:
  QPainterPath::lineTo(&path,7.0,dVar1);
  local_88 = (undefined1 *)0x0;
  local_78 = (undefined1 *)0x402c000000000000;
  puStack_80 = (undefined1 *)dVar4;
  local_70 = dVar5;
  QPainterPath::arcTo((QRectF *)&path,-90.0,-90.0);
  QPainterPath::lineTo(&path,0.0,(double)(uVar15 + 7));
  local_88 = (undefined1 *)0x0;
  local_78 = (undefined1 *)0x402c000000000000;
  puStack_80 = (undefined1 *)y;
  local_70 = dVar3;
  QPainterPath::arcTo((QRectF *)&path,180.0,-90.0);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_50._0_8_ = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  QBitmap::QBitmap((QBitmap *)&local_88,(QSize *)&local_50);
  QColor::QColor(&local_50,color0);
  QPixmap::fill((QColor *)&local_88);
  _painter1 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter1,(QPaintDevice *)&local_88);
  QBrush::QBrush((QBrush *)&painter2,color1,SolidPattern);
  QPen::QPen((QPen *)&local_50,(QBrush *)&painter2,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&painter1);
  QPen::~QPen((QPen *)&local_50);
  QBrush::~QBrush((QBrush *)&painter2);
  QBrush::QBrush((QBrush *)&local_50,color1,SolidPattern);
  QPainter::setBrush((QBrush *)&painter1);
  QBrush::~QBrush((QBrush *)&local_50);
  QPainter::drawPath((QPainterPath *)&painter1);
  QWidget::setMask(&this->super_QWidget,(QBitmap *)&local_88);
  QPixmap::QPixmap((QPixmap *)&local_50,&local_58);
  QPixmap::operator=(&this->pixmap,(QPixmap *)&local_50);
  QPixmap::~QPixmap((QPixmap *)&local_50);
  _painter2 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter2,(QPaintDevice *)&this->pixmap);
  pQVar11 = QWidget::palette(&this->super_QWidget);
  pQVar12 = QPalette::color(pQVar11,Window);
  auVar21 = QColor::darker((int)pQVar12);
  local_50._0_8_ = auVar21._0_8_;
  local_50.ct._4_4_ = auVar21._8_4_;
  local_50.ct.argb.pad = auVar21._12_2_;
  QBrush::QBrush(local_a8,(QColor *)&local_50,SolidPattern);
  QPen::QPen(local_a0,local_a8,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&painter2);
  QPen::~QPen(local_a0);
  QBrush::~QBrush(local_a8);
  pQVar11 = QWidget::palette(&this->super_QWidget);
  QPalette::color(pQVar11,Window);
  QPainter::setBrush((QColor *)&painter2);
  QPainter::drawPath((QPainterPath *)&painter2);
  if (0 < msecs) {
    QBasicTimer::start(&this->timer,(Duration)((ulong)(uint)msecs * 1000000),(QObject *)this);
  }
  QWidget::show(&this->super_QWidget);
  QPainter::~QPainter(&painter2);
  QPainter::~QPainter(&painter1);
  QBitmap::~QBitmap((QBitmap *)&local_88);
  QPainterPath::~QPainterPath(&path);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBalloonTip::balloon(const QPoint& pos, int msecs, bool showArrow)
{
    this->showArrow = showArrow;
    QScreen *screen = QGuiApplication::screenAt(pos);
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    QRect screenRect = screen->geometry();
    QSize sh = sizeHint();
    const int border = 1;
    const int ah = 18, ao = 18, aw = 18, rc = 7;
    bool arrowAtTop = (pos.y() + sh.height() + ah < screenRect.height());
    bool arrowAtLeft = (pos.x() + sh.width() - ao < screenRect.width());
    setContentsMargins(border + 3,  border + (arrowAtTop ? ah : 0) + 2, border + 3, border + (arrowAtTop ? 0 : ah) + 2);
    updateGeometry();
    sh  = sizeHint();

    int ml, mr, mt, mb;
    QSize sz = sizeHint();
    if (!arrowAtTop) {
        ml = mt = 0;
        mr = sz.width() - 1;
        mb = sz.height() - ah - 1;
    } else {
        ml = 0;
        mt = ah;
        mr = sz.width() - 1;
        mb = sz.height() - 1;
    }

    QPainterPath path;
    path.moveTo(ml + rc, mt);
    if (arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ml + ao, mt);
            path.lineTo(ml + ao, mt - ah);
            path.lineTo(ml + ao + aw, mt);
        }
        move(qMax(pos.x() - ao, screenRect.left() + 2), pos.y());
    } else if (arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao - aw, mt);
            path.lineTo(mr - ao, mt - ah);
            path.lineTo(mr - ao, mt);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2), pos.y());
    }
    path.lineTo(mr - rc, mt);
    path.arcTo(QRect(mr - rc*2, mt, rc*2, rc*2), 90, -90);
    path.lineTo(mr, mb - rc);
    path.arcTo(QRect(mr - rc*2, mb - rc*2, rc*2, rc*2), 0, -90);
    if (!arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao, mb);
            path.lineTo(mr - ao, mb + ah);
            path.lineTo(mr - ao - aw, mb);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2),
             pos.y() - sh.height());
    } else if (!arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ao + aw, mb);
            path.lineTo(ao, mb + ah);
            path.lineTo(ao, mb);
        }
        move(qMax(pos.x() - ao, screenRect.x() + 2), pos.y() - sh.height());
    }
    path.lineTo(ml + rc, mb);
    path.arcTo(QRect(ml, mb - rc*2, rc*2, rc*2), -90, -90);
    path.lineTo(ml, mt + rc);
    path.arcTo(QRect(ml, mt, rc*2, rc*2), 180, -90);

    // Set the mask
    QBitmap bitmap = QBitmap(sizeHint());
    bitmap.fill(Qt::color0);
    QPainter painter1(&bitmap);
    painter1.setPen(QPen(Qt::color1, border));
    painter1.setBrush(QBrush(Qt::color1));
    painter1.drawPath(path);
    setMask(bitmap);

    // Draw the border
    pixmap = QPixmap(sz);
    QPainter painter2(&pixmap);
    painter2.setPen(QPen(palette().color(QPalette::Window).darker(160), border));
    painter2.setBrush(palette().color(QPalette::Window));
    painter2.drawPath(path);

    if (msecs > 0)
        timer.start(msecs * 1ms, this);
    show();
}